

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O0

void __thiscall
Pl_Function::Pl_Function
          (Pl_Function *this,char *identifier,Pipeline *next,writer_c_char_t fn,void *udata)

{
  Members *this_00;
  function<void(unsigned_char_const*,unsigned_long)> *this_01;
  anon_class_24_3_cbc5c5a7_conflict local_80;
  undefined1 local_61;
  function<void_(const_unsigned_char_*,_unsigned_long)> local_60;
  void *local_30;
  void *udata_local;
  writer_c_char_t fn_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_Function *this_local;
  
  local_30 = udata;
  udata_local = fn;
  fn_local = (writer_c_char_t)next;
  next_local = (Pipeline *)identifier;
  identifier_local = (char *)this;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_00594388;
  this_00 = (Members *)operator_new(0x20);
  local_61 = 1;
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::function(&local_60,(nullptr_t)0x0);
  Members::Members(this_00,&local_60);
  local_61 = 0;
  std::unique_ptr<Pl_Function::Members,std::default_delete<Pl_Function::Members>>::
  unique_ptr<std::default_delete<Pl_Function::Members>,void>
            ((unique_ptr<Pl_Function::Members,std::default_delete<Pl_Function::Members>> *)&this->m,
             this_00);
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::~function(&local_60);
  local_80.identifier = (char *)next_local;
  local_80.fn = (writer_c_char_t)udata_local;
  local_80.udata = local_30;
  this_01 = (function<void(unsigned_char_const*,unsigned_long)> *)
            std::unique_ptr<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>::
            operator->(&this->m);
  std::function<void(unsigned_char_const*,unsigned_long)>::operator=(this_01,&local_80);
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_c_char_t fn, void* udata) :
    Pipeline(identifier, next),
    m(new Members(nullptr))
{
    m->fn = [identifier, fn, udata](unsigned char const* data, size_t len) {
        int code = fn(reinterpret_cast<char const*>(data), len, udata);
        if (code != 0) {
            throw std::runtime_error(
                std::string(identifier) + " function returned code " + std::to_string(code));
        }
    };
}